

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O1

CURLcode Curl_pretransfer(Curl_easy *data)

{
  undefined1 *puVar1;
  unsigned_long *puVar2;
  uchar uVar3;
  uint uVar4;
  unsigned_long uVar5;
  long lVar6;
  bool bVar7;
  CURLcode CVar8;
  CURLUcode CVar9;
  size_t sVar10;
  WildcardData *pWVar11;
  char *pcVar12;
  
  pcVar12 = (data->state).url;
  if ((pcVar12 == (char *)0x0) && ((data->set).uh == (CURLU *)0x0)) {
LAB_0015f1db:
    Curl_failf(data,"No URL set");
    return CURLE_URL_MALFORMAT;
  }
  if (((data->state).field_0x775 & 0x40) != 0) {
    (*Curl_cfree)(pcVar12);
    (data->state).url = (char *)0x0;
    puVar1 = &(data->state).field_0x775;
    *puVar1 = *puVar1 & 0xbf;
  }
  if (((data->state).url == (char *)0x0) && ((data->set).uh != (CURLU *)0x0)) {
    (*Curl_cfree)((data->set).str[0x2a]);
    CVar9 = curl_url_get((data->set).uh,CURLUPART_URL,(data->set).str + 0x2a,0);
    if (CVar9 != CURLUE_OK) goto LAB_0015f1db;
  }
  if (((data->set).postfields != (void *)0x0) && ((data->set).set_resume_from != 0)) {
    Curl_failf(data,"cannot mix POSTFIELDS with RESUME_FROM");
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  uVar4 = *(uint *)&(data->set).field_0x8ca;
  *(uint *)&(data->state).field_0x774 =
       (*(uint *)&(data->state).field_0x774 & 0xffffcfff) + (uVar4 & 0x200) * 8 +
       (uVar4 & 0x800) * 4;
  (data->state).httpreq = (data->set).method;
  (data->state).url = (data->set).str[0x2a];
  CVar8 = Curl_ssl_initsessions(data,(data->set).general_ssl.max_ssl_sessions);
  if (CVar8 != CURLE_OK) {
    return CVar8;
  }
  (data->state).requests = 0;
  (data->state).followlocation = 0;
  (data->state).httpwant = (data->set).httpwant;
  (data->state).httpversion = '\0';
  puVar1 = &(data->state).field_0x774;
  *puVar1 = *puVar1 & 0xd5;
  uVar5 = (data->set).proxyauth;
  (data->state).authhost.want = (data->set).httpauth;
  (data->state).authproxy.want = uVar5;
  (*Curl_cfree)((data->info).wouldredirect);
  (data->info).wouldredirect = (char *)0x0;
  uVar3 = (data->state).httpreq;
  if ((uVar3 == '\0') || (uVar3 == '\x05')) {
    (data->state).infilesize = 0;
  }
  else {
    if (uVar3 == '\x04') {
      sVar10 = (data->set).filesize;
    }
    else {
      pcVar12 = (char *)(data->set).postfields;
      lVar6 = (data->set).postfieldsize;
      (data->state).infilesize = lVar6;
      if (lVar6 != -1 || pcVar12 == (char *)0x0) goto LAB_0015f237;
      sVar10 = strlen(pcVar12);
    }
    (data->state).infilesize = sVar10;
  }
LAB_0015f237:
  Curl_cookie_loadfiles(data);
  if ((data->state).resolve == (curl_slist *)0x0) {
    CVar8 = CURLE_OK;
  }
  else {
    CVar8 = Curl_loadhostpairs(data);
  }
  Curl_hsts_loadfiles(data);
  if (CVar8 != CURLE_OK) goto LAB_0015f365;
  puVar1 = &(data->state).field_0x774;
  *puVar1 = *puVar1 | 0x10;
  Curl_initinfo(data);
  Curl_pgrsResetTransferSizes(data);
  Curl_pgrsStartNow(data);
  puVar2 = &(data->state).authhost.picked;
  *puVar2 = *puVar2 & (data->state).authhost.want;
  puVar2 = &(data->state).authproxy.picked;
  *puVar2 = *puVar2 & (data->state).authproxy.want;
  uVar4 = *(uint *)&(data->set).field_0x8ca;
  *(uint *)&(data->state).field_0x774 =
       *(uint *)&(data->state).field_0x774 & 0xffffffbf | uVar4 >> 0xb & 0x40;
  if ((uVar4 >> 0x11 & 1) != 0) {
    if (data->wildcard == (WildcardData *)0x0) {
      pWVar11 = (WildcardData *)(*Curl_ccalloc)(1,0x48);
      data->wildcard = pWVar11;
      if (pWVar11 != (WildcardData *)0x0) goto LAB_0015f2f4;
      CVar8 = CURLE_OUT_OF_MEMORY;
      bVar7 = false;
    }
    else {
LAB_0015f2f4:
      pWVar11 = data->wildcard;
      if (pWVar11->state == '\0') {
        if (pWVar11->ftpwc != (ftp_wc *)0x0) {
          (*pWVar11->dtor)(pWVar11->ftpwc);
        }
        (*Curl_cfree)(pWVar11->pattern);
        bVar7 = false;
        pWVar11->pattern = (char *)0x0;
        (*Curl_cfree)(pWVar11->path);
        pWVar11->path = (char *)0x0;
        CVar8 = Curl_wildcard_init(pWVar11);
        if (CVar8 != CURLE_OK) {
          CVar8 = CURLE_OUT_OF_MEMORY;
          goto LAB_0015f34b;
        }
      }
      CVar8 = CURLE_URL_MALFORMAT;
      bVar7 = true;
    }
LAB_0015f34b:
    if (!bVar7) {
      return CVar8;
    }
  }
  CVar8 = Curl_hsts_loadcb(data,data->hsts);
LAB_0015f365:
  if ((data->set).str[0x2b] != (char *)0x0) {
    (*Curl_cfree)((data->state).aptr.uagent);
    (data->state).aptr.uagent = (char *)0x0;
    pcVar12 = curl_maprintf("User-Agent: %s\r\n",(data->set).str[0x2b]);
    (data->state).aptr.uagent = pcVar12;
    if (pcVar12 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  if (CVar8 == CURLE_OK) {
    CVar8 = Curl_setstropt(&(data->state).aptr.user,(data->set).str[0x2d]);
  }
  if (CVar8 == CURLE_OK) {
    CVar8 = Curl_setstropt(&(data->state).aptr.passwd,(data->set).str[0x2e]);
  }
  if (CVar8 == CURLE_OK) {
    CVar8 = Curl_setstropt(&(data->state).aptr.proxyuser,(data->set).str[0x30]);
  }
  if (CVar8 == CURLE_OK) {
    CVar8 = Curl_setstropt(&(data->state).aptr.proxypasswd,(data->set).str[0x31]);
  }
  (data->req).headerbytecount = 0;
  Curl_headers_cleanup(data);
  return CVar8;
}

Assistant:

CURLcode Curl_pretransfer(struct Curl_easy *data)
{
  CURLcode result;

  if(!data->state.url && !data->set.uh) {
    /* we cannot do anything without URL */
    failf(data, "No URL set");
    return CURLE_URL_MALFORMAT;
  }

  /* since the URL may have been redirected in a previous use of this handle */
  if(data->state.url_alloc) {
    /* the already set URL is allocated, free it first! */
    Curl_safefree(data->state.url);
    data->state.url_alloc = FALSE;
  }

  if(!data->state.url && data->set.uh) {
    CURLUcode uc;
    free(data->set.str[STRING_SET_URL]);
    uc = curl_url_get(data->set.uh,
                      CURLUPART_URL, &data->set.str[STRING_SET_URL], 0);
    if(uc) {
      failf(data, "No URL set");
      return CURLE_URL_MALFORMAT;
    }
  }

  if(data->set.postfields && data->set.set_resume_from) {
    /* we cannot */
    failf(data, "cannot mix POSTFIELDS with RESUME_FROM");
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }

  data->state.prefer_ascii = data->set.prefer_ascii;
#ifdef CURL_LIST_ONLY_PROTOCOL
  data->state.list_only = data->set.list_only;
#endif
  data->state.httpreq = data->set.method;
  data->state.url = data->set.str[STRING_SET_URL];

  /* Init the SSL session ID cache here. We do it here since we want to do it
     after the *_setopt() calls (that could specify the size of the cache) but
     before any transfer takes place. */
  result = Curl_ssl_initsessions(data, data->set.general_ssl.max_ssl_sessions);
  if(result)
    return result;

  data->state.requests = 0;
  data->state.followlocation = 0; /* reset the location-follow counter */
  data->state.this_is_a_follow = FALSE; /* reset this */
  data->state.errorbuf = FALSE; /* no error has occurred */
  data->state.httpwant = data->set.httpwant;
  data->state.httpversion = 0;
  data->state.authproblem = FALSE;
  data->state.authhost.want = data->set.httpauth;
  data->state.authproxy.want = data->set.proxyauth;
  Curl_safefree(data->info.wouldredirect);
  Curl_data_priority_clear_state(data);

  if(data->state.httpreq == HTTPREQ_PUT)
    data->state.infilesize = data->set.filesize;
  else if((data->state.httpreq != HTTPREQ_GET) &&
          (data->state.httpreq != HTTPREQ_HEAD)) {
    data->state.infilesize = data->set.postfieldsize;
    if(data->set.postfields && (data->state.infilesize == -1))
      data->state.infilesize = (curl_off_t)strlen(data->set.postfields);
  }
  else
    data->state.infilesize = 0;

  /* If there is a list of cookie files to read, do it now! */
  Curl_cookie_loadfiles(data);

  /* If there is a list of host pairs to deal with */
  if(data->state.resolve)
    result = Curl_loadhostpairs(data);

  /* If there is a list of hsts files to read */
  Curl_hsts_loadfiles(data);

  if(!result) {
    /* Allow data->set.use_port to set which port to use. This needs to be
     * disabled for example when we follow Location: headers to URLs using
     * different ports! */
    data->state.allow_port = TRUE;

#if defined(HAVE_SIGNAL) && defined(SIGPIPE) && !defined(HAVE_MSG_NOSIGNAL)
    /*************************************************************
     * Tell signal handler to ignore SIGPIPE
     *************************************************************/
    if(!data->set.no_signal)
      data->state.prev_signal = signal(SIGPIPE, SIG_IGN);
#endif

    Curl_initinfo(data); /* reset session-specific information "variables" */
    Curl_pgrsResetTransferSizes(data);
    Curl_pgrsStartNow(data);

    /* In case the handle is reused and an authentication method was picked
       in the session we need to make sure we only use the one(s) we now
       consider to be fine */
    data->state.authhost.picked &= data->state.authhost.want;
    data->state.authproxy.picked &= data->state.authproxy.want;

#ifndef CURL_DISABLE_FTP
    data->state.wildcardmatch = data->set.wildcard_enabled;
    if(data->state.wildcardmatch) {
      struct WildcardData *wc;
      if(!data->wildcard) {
        data->wildcard = calloc(1, sizeof(struct WildcardData));
        if(!data->wildcard)
          return CURLE_OUT_OF_MEMORY;
      }
      wc = data->wildcard;
      if(wc->state < CURLWC_INIT) {
        if(wc->ftpwc)
          wc->dtor(wc->ftpwc);
        Curl_safefree(wc->pattern);
        Curl_safefree(wc->path);
        result = Curl_wildcard_init(wc); /* init wildcard structures */
        if(result)
          return CURLE_OUT_OF_MEMORY;
      }
    }
#endif
    result = Curl_hsts_loadcb(data, data->hsts);
  }

  /*
   * Set user-agent. Used for HTTP, but since we can attempt to tunnel
   * basically anything through an HTTP proxy we cannot limit this based on
   * protocol.
   */
  if(data->set.str[STRING_USERAGENT]) {
    Curl_safefree(data->state.aptr.uagent);
    data->state.aptr.uagent =
      aprintf("User-Agent: %s\r\n", data->set.str[STRING_USERAGENT]);
    if(!data->state.aptr.uagent)
      return CURLE_OUT_OF_MEMORY;
  }

  if(!result)
    result = Curl_setstropt(&data->state.aptr.user,
                            data->set.str[STRING_USERNAME]);
  if(!result)
    result = Curl_setstropt(&data->state.aptr.passwd,
                            data->set.str[STRING_PASSWORD]);
#ifndef CURL_DISABLE_PROXY
  if(!result)
    result = Curl_setstropt(&data->state.aptr.proxyuser,
                            data->set.str[STRING_PROXYUSERNAME]);
  if(!result)
    result = Curl_setstropt(&data->state.aptr.proxypasswd,
                            data->set.str[STRING_PROXYPASSWORD]);
#endif

  data->req.headerbytecount = 0;
  Curl_headers_cleanup(data);
  return result;
}